

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O3

string * __thiscall
NewSymbolTreeVisitor::UserTypeResolving_abi_cxx11_
          (string *__return_storage_ptr__,NewSymbolTreeVisitor *this,Symbol *symbol)

{
  NewScopeLayer *pNVar1;
  pointer pcVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  runtime_error *this_00;
  NewScopeLayer **ppNVar5;
  
  ppNVar5 = &this->current_layer_;
  do {
    pNVar1 = *ppNVar5;
    if (pNVar1->parent_ == (NewScopeLayer *)0x0) goto LAB_001151da;
    ppNVar5 = &pNVar1->parent_;
    iVar3 = std::
            _Hashtable<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(pNVar1->user_type_system_)._M_h,symbol);
  } while (iVar3.
           super__Node_iterator_base<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
           ._M_cur == (__node_type *)0x0);
  if (*ppNVar5 != (NewScopeLayer *)0x0) {
    pmVar4 = std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pNVar1->user_type_system_,symbol);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pmVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pmVar4->_M_string_length);
    return __return_storage_ptr__;
  }
LAB_001151da:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid method invocation from non user type");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string NewSymbolTreeVisitor::UserTypeResolving(const Symbol& symbol) {
  NewScopeLayer* local_current = current_layer_;

  while (local_current->parent_ != nullptr &&
         local_current->user_type_system_.find(symbol) ==
             local_current->user_type_system_.end()) {
    local_current = local_current->parent_;
  }

  if (local_current->parent_ == nullptr) {
    throw std::runtime_error("Invalid method invocation from non user type");
  }

  return local_current->user_type_system_[symbol];
}